

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QItemSelectionRange>::reallocate
          (QMovableArrayOps<QItemSelectionRange> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QItemSelectionRange>_*,_QItemSelectionRange_*> pVar1;
  
  pVar1 = QTypedArrayData<QItemSelectionRange>::reallocateUnaligned
                    ((this->super_QGenericArrayOps<QItemSelectionRange>).
                     super_QArrayDataPointer<QItemSelectionRange>.d,
                     (this->super_QGenericArrayOps<QItemSelectionRange>).
                     super_QArrayDataPointer<QItemSelectionRange>.ptr,alloc,option);
  if (pVar1.second != (QItemSelectionRange *)0x0) {
    (this->super_QGenericArrayOps<QItemSelectionRange>).super_QArrayDataPointer<QItemSelectionRange>
    .d = pVar1.first;
    (this->super_QGenericArrayOps<QItemSelectionRange>).super_QArrayDataPointer<QItemSelectionRange>
    .ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }